

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_medium_Test::TestBody
          (ByteBufferTest_test_read_write_medium_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  int32_t medium2;
  int32_t medium1;
  ByteBuffer byte_buffer2;
  ByteBuffer byte_buffer1;
  AssertHelper local_90;
  Message local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  int local_70 [2];
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [5];
  ByteBuffer local_38 [48];
  
  local_70[1] = 0xfff0e;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_38,2);
  bidfx_public_api::tools::ByteBuffer::WriteMedium((int)local_38);
  local_88.ss_.ptr_._0_4_ = bidfx_public_api::tools::ByteBuffer::ReadMedium();
  testing::internal::CmpHelperEQ<int,int>
            (local_68,"medium1","byte_buffer1.ReadMedium()",local_70 + 1,(int *)&local_88);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message(&local_88);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xa4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (CONCAT44(local_88.ss_.ptr_._4_4_,local_88.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_88.ss_.ptr_._4_4_,local_88.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_.ptr_._4_4_,local_88.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70[0] = -0xfff0e;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)local_68,2);
  bidfx_public_api::tools::ByteBuffer::WriteMedium((int)local_68);
  local_90.data_._0_4_ = bidfx_public_api::tools::ByteBuffer::ReadMedium();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_88,"medium2","byte_buffer2.ReadMedium()",local_70,(int *)&local_90);
  if (local_88.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,local_90.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_68);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_38);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_medium)
{
    int32_t medium1 = 1048334;
    ByteBuffer byte_buffer1(2);
    byte_buffer1.WriteMedium(medium1);
    EXPECT_EQ(medium1, byte_buffer1.ReadMedium());

    int32_t medium2 = -1048334;
    ByteBuffer byte_buffer2(2);
    byte_buffer2.WriteMedium(medium2);
    EXPECT_EQ(medium2, byte_buffer2.ReadMedium());
}